

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

char * lua_setupvalue(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  char *pcVar2;
  GCobj *v;
  GCobj *o;
  TValue *val;
  GCobj *local_28;
  TValue *local_20;
  
  pTVar1 = index2adr(L,idx);
  pcVar2 = lj_debug_uvnamev(pTVar1,n - 1,&local_20,&local_28);
  if (pcVar2 != (char *)0x0) {
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    *local_20 = pTVar1[-1];
    if ((((L->top->field_2).it + 0xd < 9) &&
        (v = (GCobj *)(ulong)(L->top->u32).lo, ((v->gch).marked & 3) != 0)) &&
       (((local_28->gch).marked & 4) != 0)) {
      lj_gc_barrierf((global_State *)(ulong)(L->glref).ptr32,local_28,v);
    }
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_setupvalue(lua_State *L, int idx, int n)
{
  cTValue *f = index2adr(L, idx);
  TValue *val;
  GCobj *o;
  const char *name;
  lj_checkapi_slot(1);
  name = lj_debug_uvnamev(f, (uint32_t)(n-1), &val, &o);
  if (name) {
    L->top--;
    copyTV(L, val, L->top);
    lj_gc_barrier(L, o, L->top);
  }
  return name;
}